

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

void __thiscall
wasm::StructUtils::StructValuesMap<wasm::LUBFinder>::combineInto
          (StructValuesMap<wasm::LUBFinder> *this,StructValuesMap<wasm::LUBFinder> *combinedInfos)

{
  _Hash_node_base *p_Var1;
  pointer pLVar2;
  bool bVar3;
  StructValues<wasm::LUBFinder> *pSVar4;
  Type TVar5;
  ulong uVar6;
  ulong uVar7;
  
  p_Var1 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::LUBFinder>_>_>_>
           )._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      return;
    }
    if (p_Var1[3]._M_nxt != p_Var1[2]._M_nxt) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        pSVar4 = operator[](combinedInfos,(HeapType)p_Var1[1]._M_nxt);
        pLVar2 = (pSVar4->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                 super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(pSVar4->super_vector<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>).
                          super__Vector_base<wasm::LUBFinder,_std::allocator<wasm::LUBFinder>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3) <= uVar6) {
          __assert_fail("index < this->size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                        ,0x27,
                        "T &wasm::StructUtils::StructValues<wasm::LUBFinder>::operator[](size_t) [T = wasm::LUBFinder]"
                       );
        }
        if ((ulong)((long)p_Var1[3]._M_nxt - (long)p_Var1[2]._M_nxt >> 3) <= uVar6) {
          __assert_fail("index < this->size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                        ,0x2c,
                        "const T &wasm::StructUtils::StructValues<wasm::LUBFinder>::operator[](size_t) const [T = wasm::LUBFinder]"
                       );
        }
        TVar5 = wasm::Type::getLeastUpperBound
                          (pLVar2[uVar6].lub.id,(Type)p_Var1[2]._M_nxt[uVar6]._M_nxt);
        pLVar2[uVar6].lub.id = TVar5.id;
        bVar3 = uVar7 < (ulong)((long)p_Var1[3]._M_nxt - (long)p_Var1[2]._M_nxt >> 3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    p_Var1 = p_Var1->_M_nxt;
  } while( true );
}

Assistant:

void combineInto(StructValuesMap<T>& combinedInfos) const {
    for (auto& [type, info] : *this) {
      for (Index i = 0; i < info.size(); i++) {
        combinedInfos[type][i].combine(info[i]);
      }
    }
  }